

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.h
# Opt level: O0

TSymbol * __thiscall glslang::TSymbolTable::find(TSymbolTable *this,TString *name,int *thisDepth)

{
  bool bVar1;
  int iVar2;
  reference ppTVar3;
  TSymbol *pTVar4;
  bool local_39;
  TSymbol *symbol;
  int level;
  int *thisDepth_local;
  TString *name_local;
  TSymbolTable *this_local;
  
  iVar2 = currentLevel(this);
  *thisDepth = 0;
  do {
    symbol._4_4_ = iVar2;
    ppTVar3 = std::
              vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
              operator[](&this->table,(long)symbol._4_4_);
    bVar1 = TSymbolTableLevel::isThisLevel(*ppTVar3);
    if (bVar1) {
      *thisDepth = *thisDepth + 1;
    }
    ppTVar3 = std::
              vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>::
              operator[](&this->table,(long)symbol._4_4_);
    pTVar4 = TSymbolTableLevel::find(*ppTVar3,name);
    local_39 = pTVar4 == (TSymbol *)0x0 && -1 < symbol._4_4_ + -1;
    iVar2 = symbol._4_4_ + -1;
  } while (local_39);
  ppTVar3 = std::vector<glslang::TSymbolTableLevel_*,_std::allocator<glslang::TSymbolTableLevel_*>_>
            ::operator[](&this->table,(long)symbol._4_4_);
  bVar1 = TSymbolTableLevel::isThisLevel(*ppTVar3);
  if (!bVar1) {
    *thisDepth = 0;
  }
  return pTVar4;
}

Assistant:

TSymbol* find(const TString& name, int& thisDepth)
    {
        int level = currentLevel();
        TSymbol* symbol;
        thisDepth = 0;
        do {
            if (table[level]->isThisLevel())
                ++thisDepth;
            symbol = table[level]->find(name);
            --level;
        } while (symbol == nullptr && level >= 0);

        if (! table[level + 1]->isThisLevel())
            thisDepth = 0;

        return symbol;
    }